

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

RefCntAutoPtr<Diligent::IAsyncTask> __thiscall
Diligent::anon_unknown_1::CompiledShaderGL::GetCompileTask(CompiledShaderGL *this)

{
  long in_RSI;
  
  AsyncInitializer::GetAsyncTask
            ((AsyncInitializer *)this,
             (unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
              *)(in_RSI + 0xe0));
  return (RefCntAutoPtr<Diligent::IAsyncTask>)(IAsyncTask *)this;
}

Assistant:

virtual RefCntAutoPtr<IAsyncTask> GetCompileTask() const override final
    {
        return AsyncInitializer::GetAsyncTask(m_AsyncInitializer);
    }